

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O3

void __thiscall
pstore::index::
hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::iterator_base<true>::move_to_left_most_child(iterator_base<true> *this,index_pointer node)

{
  ulong uVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  index_pointer *piVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  internal_node *piVar5;
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  local_48;
  
  if (((ulong)node.internal_ & 1) == 0) {
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      uVar1 = (this->visited_parents_).elements_;
      if (0xc < uVar1) {
        assert_failed("elements_ < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                      ,100);
      }
      (this->visited_parents_).elements_ = uVar1 + 1;
      (this->visited_parents_).c_._M_elems[uVar1].node = node;
      (this->visited_parents_).c_._M_elems[uVar1].position = 0;
      if ((this->visited_parents_).elements_ < 0xc) {
        details::internal_node::get_node(&local_48,this->db_,node);
        _Var3._M_pi = local_48.first.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        peVar2 = local_48.first.
                 super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        local_48.first.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (internal_node *)0x0;
        local_48.first.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        piVar5 = local_48.second;
        if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
           piVar5 = local_48.second,
           local_48.first.
           super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.first.
                     super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (peVar2 != piVar5 && peVar2 != (internal_node *)0x0) {
          assert_failed("!store_node || store_node.get () == internal",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                        ,0x262);
        }
        piVar4 = details::internal_node::operator[](piVar5,0);
        node = *piVar4;
        this_00._M_pi = _Var3._M_pi;
      }
      else {
        details::linear_node::get_node
                  ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                    *)&local_48,this->db_,node);
        _Var3._M_pi = local_48.first.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_48.first.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (internal_node *)0x0;
        local_48.first.
        super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        piVar5 = local_48.second;
        if ((this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi),
           piVar5 = local_48.second,
           local_48.first.
           super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.first.
                     super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        node.internal_ = (internal_node *)details::linear_node::operator[](piVar5,0);
        this_00._M_pi = _Var3._M_pi;
      }
    } while (((ulong)node.internal_ & 1) != 0);
  }
  uVar1 = (this->visited_parents_).elements_;
  if (0xc < uVar1) {
    assert_failed("elements_ < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                  ,100);
  }
  (this->visited_parents_).elements_ = uVar1 + 1;
  (this->visited_parents_).c_._M_elems[uVar1].node = node;
  (this->visited_parents_).c_._M_elems[uVar1].position = 0xffffffffffffffff;
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return;
}

Assistant:

void hamt_map<KeyType, ValueType, Hash, KeyEqual>::iterator_base<
            IsConstIterator>::move_to_left_most_child (index_pointer node) {

            std::shared_ptr<void const> store_node;
            while (!node.is_leaf ()) {
                visited_parents_.push (details::parent_type{node, 0});
                if (visited_parents_.size () <= details::max_internal_depth) {
                    internal_node const * internal = nullptr;
                    std::tie (store_node, internal) = internal_node::get_node (db_, node);
                    PSTORE_ASSERT (!store_node || store_node.get () == internal);
                    node = (*internal)[0];
                } else {
                    linear_node const * linear = nullptr;
                    std::tie (store_node, linear) = linear_node::get_node (db_, node);
                    node = (*linear)[0];
                }
            }

            // Push the leaf on the stack.
            visited_parents_.push (details::parent_type{node});
        }